

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_draw.cpp
# Opt level: O0

void Am_Draw_Check_Button_Box
               (am_rect r,Am_Drawonable *draw,Am_Widget_Look look,bool selected,
               bool interim_selected,Computed_Colors_Record *color_rec,bool mask)

{
  am_rect r_00;
  am_rect r_01;
  ulong uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined8 in_stack_fffffffffffffea8;
  undefined8 uVar9;
  Am_Style *local_120;
  bool local_101;
  Am_Image_Array local_100;
  Am_Style local_f8;
  Am_Style local_f0;
  Am_Style fill_style_1;
  Am_Style local_e0;
  Am_Style line_style_1;
  float y;
  float twopix;
  float max_y;
  float min_y;
  float right_x;
  float center_x;
  float left_x;
  float pix;
  Am_Style local_b0;
  Am_Style line_style;
  float ninth;
  Am_Style fill_style;
  Am_Style local_90;
  ulong local_88;
  ulong uStack_80;
  Am_Style local_78;
  Am_Style local_70;
  ulong local_68;
  ulong uStack_60;
  Am_Style local_48;
  Am_Style lower_right;
  Am_Style upper_left;
  bool depressed;
  bool mask_local;
  bool interim_selected_local;
  bool selected_local;
  Am_Drawonable *draw_local;
  undefined1 auStack_20 [4];
  Am_Widget_Look look_local;
  am_rect r_local;
  
  uVar3 = (undefined4)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  uVar1 = r._8_8_;
  _auStack_20 = r._0_8_;
  local_101 = true;
  if (!selected) {
    local_101 = interim_selected;
  }
  (*draw->_vptr_Am_Drawonable[0x21])
            (draw,_auStack_20 & 0xffffffff,_auStack_20 >> 0x20,uVar1 & 0xffffffff,uVar1 >> 0x20);
  r_local.left = r.width;
  r_local.top = r.height;
  if (look.value == Am_MOTIF_LOOK_val) {
    if (mask) {
      (*draw->_vptr_Am_Drawonable[0x2c])
                (draw,&Am_No_Style,&Am_On_Bits,_auStack_20 & 0xffffffff,(ulong)look_local.value,
                 uVar1 & 0xffffffff,CONCAT44(uVar3,r_local.top),0);
    }
    else {
      Am_Draw_Motif_Box((int)auStack_20,look_local.value,r_local.left,r_local.top,local_101,
                        color_rec,draw);
    }
  }
  else if (look.value == Am_WINDOWS_LOOK_val) {
    Am_Style::Am_Style(&lower_right);
    Am_Style::Am_Style(&local_48);
    Am_Style::operator=(&lower_right,&color_rec->data->background_style);
    Am_Style::operator=(&local_48,&color_rec->data->highlight_style);
    if (mask) {
      uVar9 = CONCAT44(uVar3,r_local.top);
      (*draw->_vptr_Am_Drawonable[0x2c])
                (draw,&Am_On_Bits,&Am_No_Style,_auStack_20 & 0xffffffff,_auStack_20 >> 0x20,
                 uVar1 & 0xffffffff,uVar9,0);
      uVar3 = (undefined4)((ulong)uVar9 >> 0x20);
    }
    else {
      local_68 = _auStack_20;
      uStack_60 = uVar1;
      Am_Style::Am_Style(&local_70,&lower_right);
      Am_Style::Am_Style(&local_78,&local_48);
      r_01.width = (undefined4)uStack_60;
      r_01.height = uStack_60._4_4_;
      r_01.left = (undefined4)local_68;
      r_01.top = local_68._4_4_;
      Am_Draw_Rect_Border(r_01,&local_70,&local_78,draw);
      Am_Style::~Am_Style(&local_78);
      Am_Style::~Am_Style(&local_70);
    }
    Inset_Rect((am_rect *)auStack_20,1);
    Am_Style::operator=(&lower_right,&color_rec->data->shadow_style);
    Am_Style::operator=(&local_48,&color_rec->data->foreground_style);
    if (mask) {
      uVar9 = CONCAT44(uVar3,r_local.top);
      (*draw->_vptr_Am_Drawonable[0x2c])
                (draw,&Am_On_Bits,&Am_No_Style,_auStack_20 & 0xffffffff,_auStack_20 >> 0x20,
                 uVar1 & 0xffffffff,uVar9,0);
      uVar3 = (undefined4)((ulong)uVar9 >> 0x20);
    }
    else {
      local_88 = _auStack_20;
      uStack_80 = uVar1;
      Am_Style::Am_Style(&local_90,&lower_right);
      Am_Style::Am_Style(&fill_style,&local_48);
      r_00.width = (undefined4)uStack_80;
      r_00.height = uStack_80._4_4_;
      r_00.left = (undefined4)local_88;
      r_00.top = local_88._4_4_;
      Am_Draw_Rect_Border(r_00,&local_90,&fill_style,draw);
      Am_Style::~Am_Style(&fill_style);
      Am_Style::~Am_Style(&local_90);
    }
    Inset_Rect((am_rect *)auStack_20,1);
    if (interim_selected) {
      local_120 = &color_rec->data->foreground_style;
    }
    else {
      local_120 = &Am_White;
    }
    Am_Style::Am_Style((Am_Style *)&stack0xffffffffffffff60,local_120);
    uVar2 = 0;
    if (mask) {
      uVar2 = 7;
    }
    (*draw->_vptr_Am_Drawonable[0x2c])
              (draw,&Am_No_Style,&stack0xffffffffffffff60,_auStack_20 & 0xffffffff,
               _auStack_20 >> 0x20,uVar1 & 0xffffffff,CONCAT44(uVar3,r_local.top),uVar2);
    line_style.data._4_4_ = 0x3de38e39;
    if (selected) {
      Am_Image_Array::Am_Image_Array((Am_Image_Array *)&left_x,&Am_No_Image);
      uVar9 = 0;
      Am_Style::Am_Style(&local_b0,"black",1,Am_CAP_BUTT,Am_JOIN_MITER,Am_LINE_SOLID,"\x04\x04",2,
                         Am_FILL_SOLID,Am_FILL_POLY_EVEN_ODD,(Am_Image_Array *)&left_x);
      Am_Image_Array::~Am_Image_Array((Am_Image_Array *)&left_x);
      fVar4 = (float)r_local.left * 0.11111111;
      fVar5 = (float)(int)auStack_20;
      fVar6 = (float)(int)auStack_20;
      fVar7 = (float)(int)auStack_20;
      fVar8 = (float)(int)look_local.value;
      line_style_1.data._4_4_ = fVar4 * 2.0;
      for (line_style_1.data._0_4_ = (fVar4 * 4.0 + (float)(int)look_local.value) - 1.0;
          line_style_1.data._0_4_ <= (fVar4 * 6.0 + fVar8) - 1.0;
          line_style_1.data._0_4_ = line_style_1.data._0_4_ + 1.0) {
        uVar3 = 0;
        if (mask) {
          uVar3 = 7;
        }
        uVar9 = CONCAT44((int)((ulong)uVar9 >> 0x20),
                         (int)(line_style_1.data._0_4_ + line_style_1.data._4_4_ + 0.5));
        (*draw->_vptr_Am_Drawonable[0x2a])
                  (draw,&local_b0,&Am_No_Style,
                   (ulong)(uint)(int)(((fVar4 + fVar4 + fVar5) - 1.0) + 0.5),
                   (ulong)(uint)(int)(line_style_1.data._0_4_ + 0.5),
                   (ulong)(uint)(int)(((fVar4 * 4.0 + fVar6) - 1.0) + 0.5),uVar9,
                   (int)(((fVar4 * 8.0 + fVar7) - 1.0) + 0.5),
                   (int)((line_style_1.data._0_4_ - line_style_1.data._4_4_) + 0.5),uVar3);
      }
      Am_Style::~Am_Style(&local_b0);
    }
    Am_Style::~Am_Style((Am_Style *)&stack0xffffffffffffff60);
    Am_Style::~Am_Style(&local_48);
    Am_Style::~Am_Style(&lower_right);
  }
  else {
    if (look.value != Am_MACINTOSH_LOOK_val) {
      Am_Error("Unknown Look parameter");
    }
    Am_Image_Array::Am_Image_Array((Am_Image_Array *)&fill_style_1,&Am_No_Image);
    uVar2 = 0;
    Am_Style::Am_Style(&local_e0,"black",(interim_selected & 1) + 1,Am_CAP_BUTT,Am_JOIN_MITER,
                       Am_LINE_SOLID,"\x04\x04",2,Am_FILL_SOLID,Am_FILL_POLY_EVEN_ODD,
                       (Am_Image_Array *)&fill_style_1);
    Am_Image_Array::~Am_Image_Array((Am_Image_Array *)&fill_style_1);
    Am_Style::Am_Style(&local_f0,&Am_White);
    uVar3 = 0;
    if (mask) {
      uVar3 = 7;
    }
    (*draw->_vptr_Am_Drawonable[0x2c])
              (draw,&local_e0,&local_f0,_auStack_20 & 0xffffffff,_auStack_20 >> 0x20,
               uVar1 & 0xffffffff,CONCAT44(uVar2,r_local.top),uVar3);
    if (selected) {
      Am_Image_Array::Am_Image_Array(&local_100,&Am_No_Image);
      uVar2 = 0;
      Am_Style::Am_Style(&local_f8,"black",1,Am_CAP_BUTT,Am_JOIN_MITER,Am_LINE_SOLID,"\x04\x04",2,
                         Am_FILL_SOLID,Am_FILL_POLY_EVEN_ODD,&local_100);
      Am_Style::operator=(&local_e0,&local_f8);
      Am_Style::~Am_Style(&local_f8);
      Am_Image_Array::~Am_Image_Array(&local_100);
      uVar3 = 0;
      if (mask) {
        uVar3 = 7;
      }
      uVar9 = CONCAT44(uVar2,uVar3);
      (*draw->_vptr_Am_Drawonable[0x28])
                (draw,&local_e0,_auStack_20 & 0xffffffff,(ulong)look_local.value,
                 (ulong)(uint)((int)auStack_20 + r_local.left),
                 (ulong)(look_local.value + r_local.top),uVar9);
      uVar3 = 0;
      if (mask) {
        uVar3 = 7;
      }
      (*draw->_vptr_Am_Drawonable[0x28])
                (draw,&local_e0,_auStack_20 & 0xffffffff,
                 (ulong)((look_local.value - Am_WINDOWS_LOOK_val) + r_local.top),
                 (ulong)(uint)((int)auStack_20 + -1 + r_local.left),(ulong)look_local.value,
                 CONCAT44((int)((ulong)uVar9 >> 0x20),uVar3));
    }
    Am_Style::~Am_Style(&local_f0);
    Am_Style::~Am_Style(&local_e0);
  }
  (*draw->_vptr_Am_Drawonable[0x22])();
  return;
}

Assistant:

void
Am_Draw_Check_Button_Box(am_rect r, // coords in terms of draw
                         Am_Drawonable *draw, Am_Widget_Look look,
                         bool selected, bool interim_selected,
                         const Computed_Colors_Record &color_rec,
                         bool mask = false)
{
  bool depressed = selected || interim_selected;
  draw->Push_Clip(r.left, r.top, r.width, r.height);

  switch (look.value) {
  case Am_MOTIF_LOOK_val: // just use the every useful Am_Draw_Motif_Bo_valx
    if (mask)
      draw->Draw_Rectangle(Am_No_Style, Am_On_Bits, r.left, r.top, r.width,
                           r.height);
    else
      Am_Draw_Motif_Box(r.left, r.top, r.width, r.height, depressed, color_rec,
                        draw);
    break;
  case Am_WINDOWS_LOOK_val: {
    // draw the outside rectangle
    Am_Style upper_left, lower_right;
    upper_left = color_rec.data->background_style;
    lower_right = color_rec.data->highlight_style;
    if (mask)
      draw->Draw_Rectangle(Am_On_Bits, Am_No_Style, r.left, r.top, r.width,
                           r.height);
    else
      Am_Draw_Rect_Border(r, upper_left, lower_right, draw);
    Inset_Rect(r, 1);

    // draw the inside rectangle
    upper_left = color_rec.data->shadow_style;
    lower_right = color_rec.data->foreground_style;
    if (mask)
      draw->Draw_Rectangle(Am_On_Bits, Am_No_Style, r.left, r.top, r.width,
                           r.height);
    else
      Am_Draw_Rect_Border(r, upper_left, lower_right, draw);
    Inset_Rect(r, 1);

    // draw the fill
    Am_Style fill_style =
        interim_selected ? color_rec.data->foreground_style : Am_White;
    draw->Draw_Rectangle(Am_No_Style, fill_style, r.left, r.top, r.width,
                         r.height, mask ? Am_DRAW_MASK_COPY : Am_DRAW_COPY);

    const float ninth = (float)1 / 9;
    if (selected) {
      Am_Style line_style("black", 1); // black and 1 pixel
      float pix = ninth * r.width, left_x = 2 * pix + r.left - 1 + 0.5f,
            center_x = 4 * pix + r.left - 1 + 0.5f,
            right_x = 8 * pix + r.left - 1 + 0.5f, min_y = 4 * pix + r.top - 1,
            max_y = 6 * pix + r.top - 1, twopix = 2 * pix;
      for (float y = min_y; y <= max_y; y += 1)
        draw->Draw_2_Lines(line_style, Am_No_Style, (int)left_x, (int)(y + 0.5),
                           (int)center_x, (int)(y + twopix + 0.5), (int)right_x,
                           (int)(y - twopix + 0.5),
                           mask ? Am_DRAW_MASK_COPY : Am_DRAW_COPY);
    }
    break;
  }

  case Am_MACINTOSH_LOOK_val: {
    Am_Style line_style("black", interim_selected ? 2 : 1);
    Am_Style fill_style = Am_White;
    draw->Draw_Rectangle(line_style, fill_style, r.left, r.top, r.width,
                         r.height, mask ? Am_DRAW_MASK_COPY : Am_DRAW_COPY);
    if (selected) { // draw the x mark
      line_style = Am_Style("black", 1);
      draw->Draw_Line(line_style, r.left, r.top, r.left + r.width,
                      r.top + r.height,
                      mask ? Am_DRAW_MASK_COPY : Am_DRAW_COPY);
      draw->Draw_Line(line_style, r.left, r.top + r.height - 1,
                      r.left + r.width - 1, r.top,
                      mask ? Am_DRAW_MASK_COPY : Am_DRAW_COPY);
    }
    break;
  }

  default:
    Am_Error("Unknown Look parameter");
    break;
  } // switch( look )

  draw->Pop_Clip();
}